

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_filter_uu.c
# Opt level: O2

int uudecode_bidder_bid(archive_read_filter_bidder *self,archive_read_filter *filter)

{
  byte bVar1;
  int iVar2;
  ssize_t sVar3;
  ssize_t sVar4;
  ulong uVar5;
  long lVar6;
  uint uVar7;
  uint uVar8;
  long lVar9;
  byte *pbVar10;
  uint uVar11;
  byte *local_58;
  ssize_t avail;
  size_t nbytes_read;
  ssize_t nl;
  ssize_t ravail;
  
  local_58 = (byte *)__archive_read_filter_ahead(filter,1,&avail);
  if (local_58 == (byte *)0x0) {
    return 0;
  }
  ravail = avail;
  nbytes_read = avail;
  uVar11 = 0x14;
  do {
    sVar3 = bid_get_line(filter,&local_58,&avail,&ravail,&nl,&nbytes_read);
    pbVar10 = local_58;
    if (sVar3 < 0) {
      return 0;
    }
    if (nl == 0) {
      return 0;
    }
    uVar5 = sVar3 - nl;
    if ((long)uVar5 < 0xb) {
LAB_001ee201:
      uVar8 = 0;
    }
    else {
      iVar2 = bcmp(local_58,"begin ",6);
      lVar9 = 6;
      if (iVar2 != 0) {
        if (0x11 < uVar5) {
          iVar2 = bcmp(pbVar10,"begin-base64 ",0xd);
          lVar9 = 0xd;
          if (iVar2 == 0) goto LAB_001ee1d4;
        }
        goto LAB_001ee201;
      }
LAB_001ee1d4:
      uVar8 = (uint)lVar9;
      if (((((byte)(pbVar10[lVar9] - 0x38) < 0xf8) || ((byte)(pbVar10[lVar9 + 1] - 0x38) < 0xf8)) ||
          ((byte)(pbVar10[lVar9 + 2] - 0x38) < 0xf8)) || (pbVar10[lVar9 + 3] != 0x20))
      goto LAB_001ee201;
    }
    local_58 = pbVar10 + sVar3;
    if (uVar8 != 0) {
      iVar2 = 0;
      if (avail == sVar3) {
        return 0;
      }
      avail = avail - sVar3;
      sVar3 = bid_get_line(filter,&local_58,&avail,&ravail,&nl,&nbytes_read);
      if (nl == 0 || sVar3 < 0) {
        return 0;
      }
      lVar9 = avail - sVar3;
      sVar4 = sVar3;
      if (uVar8 != 6) goto LAB_001ee3b9;
      if (""[*local_58] == '\0') {
        return 0;
      }
      uVar7 = *local_58 & 0x3f ^ 0x20;
      if (0x2d < (byte)uVar7) {
        return 0;
      }
      pbVar10 = local_58 + 1;
      lVar6 = sVar3 + -1;
      while ((uVar8 = uVar7, sVar4 = lVar6, local_58 = pbVar10, lVar6 = sVar4 - nl, uVar8 != 0 &&
             (0 < lVar6))) {
        if (""[*local_58] == '\0') {
          return 0;
        }
        if (""[local_58[1]] == '\0') {
          return 0;
        }
        pbVar10 = local_58 + 2;
        lVar6 = sVar4 + -2;
        uVar7 = 0;
        if (1 < (int)uVar8) {
          if (""[local_58[2]] == '\0') {
            return 0;
          }
          pbVar10 = local_58 + 3;
          lVar6 = sVar4 + -3;
          uVar7 = 0;
          if (uVar8 != 2) {
            if (""[local_58[3]] == '\0') {
              return 0;
            }
            pbVar10 = local_58 + 4;
            lVar6 = sVar4 + -4;
            uVar7 = uVar8 - 3;
          }
        }
      }
      if (-1 < lVar6) {
        if ((lVar6 == 1) && (""[*local_58] != '\0' || (byte)(*local_58 + 0x9f) < 0x1a)) {
          local_58 = local_58 + 1;
          sVar4 = sVar4 + -1;
        }
        local_58 = local_58 + nl;
        if ((avail == sVar3) || (""[*local_58] == '\0')) {
LAB_001ee3b9:
          pbVar10 = local_58;
          if (uVar8 == 0xd) {
            do {
              if (sVar4 <= nl) {
                pbVar10 = pbVar10 + nl;
                if (lVar9 < 5) {
                  if (lVar9 < 1) {
                    return 0;
                  }
                }
                else {
                  avail = lVar9;
                  iVar2 = bcmp(pbVar10,"====\n",5);
                  if ((iVar2 == 0) ||
                     ((lVar9 != 5 && (iVar2 = bcmp(pbVar10,"====\r\n",6), iVar2 == 0)))) {
                    return uVar11 | 0x28;
                  }
                }
                if (""[*pbVar10] != '\0') {
                  return uVar11 + 0x1e;
                }
                return 0;
              }
              bVar1 = *pbVar10;
              sVar4 = sVar4 + -1;
              pbVar10 = pbVar10 + 1;
            } while (""[bVar1] != '\0');
          }
        }
        else {
          iVar2 = uVar11 + 0x1e;
        }
      }
      return iVar2;
    }
    uVar11 = 0;
    avail = avail - sVar3;
    if (0x1ffff < nbytes_read) {
      return 0;
    }
  } while( true );
}

Assistant:

static int
uudecode_bidder_bid(struct archive_read_filter_bidder *self,
    struct archive_read_filter *filter)
{
	const unsigned char *b;
	ssize_t avail, ravail;
	ssize_t len, nl;
	int l;
	int firstline;
	size_t nbytes_read;

	(void)self; /* UNUSED */

	b = __archive_read_filter_ahead(filter, 1, &avail);
	if (b == NULL)
		return (0);

	firstline = 20;
	ravail = avail;
	nbytes_read = avail;
	for (;;) {
		len = bid_get_line(filter, &b, &avail, &ravail, &nl, &nbytes_read);
		if (len < 0 || nl == 0)
			return (0); /* No match found. */
		if (len - nl >= 11 && memcmp(b, "begin ", 6) == 0)
			l = 6;
		else if (len -nl >= 18 && memcmp(b, "begin-base64 ", 13) == 0)
			l = 13;
		else
			l = 0;

		if (l > 0 && (b[l] < '0' || b[l] > '7' ||
		    b[l+1] < '0' || b[l+1] > '7' ||
		    b[l+2] < '0' || b[l+2] > '7' || b[l+3] != ' '))
			l = 0;

		b += len;
		avail -= len;
		if (l)
			break;
		firstline = 0;

		/* Do not read more than UUENCODE_BID_MAX_READ bytes */
		if (nbytes_read >= UUENCODE_BID_MAX_READ)
			return (0);
	}
	if (!avail)
		return (0);
	len = bid_get_line(filter, &b, &avail, &ravail, &nl, &nbytes_read);
	if (len < 0 || nl == 0)
		return (0);/* There are non-ascii characters. */
	avail -= len;

	if (l == 6) {
		if (!uuchar[*b])
			return (0);
		/* Get a length of decoded bytes. */
		l = UUDECODE(*b++); len--;
		if (l > 45)
			/* Normally, maximum length is 45(character 'M'). */
			return (0);
		while (l && len-nl > 0) {
			if (l > 0) {
				if (!uuchar[*b++])
					return (0);
				if (!uuchar[*b++])
					return (0);
				len -= 2;
				--l;
			}
			if (l > 0) {
				if (!uuchar[*b++])
					return (0);
				--len;
				--l;
			}
			if (l > 0) {
				if (!uuchar[*b++])
					return (0);
				--len;
				--l;
			}
		}
		if (len-nl < 0)
			return (0);
		if (len-nl == 1 &&
		    (uuchar[*b] ||		 /* Check sum. */
		     (*b >= 'a' && *b <= 'z'))) {/* Padding data(MINIX). */
			++b;
			--len;
		}
		b += nl;
		if (avail && uuchar[*b])
			return (firstline+30);
	}
	if (l == 13) {
		while (len-nl > 0) {
			if (!base64[*b++])
				return (0);
			--len;
		}
		b += nl;

		if (avail >= 5 && memcmp(b, "====\n", 5) == 0)
			return (firstline+40);
		if (avail >= 6 && memcmp(b, "====\r\n", 6) == 0)
			return (firstline+40);
		if (avail > 0 && base64[*b])
			return (firstline+30);
	}

	return (0);
}